

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlockSymbols.cpp
# Opt level: O0

StatementBlockSymbol *
slang::ast::StatementBlockSymbol::fromSyntax(Scope *scope,ForeachLoopStatementSyntax *syntax)

{
  string_view name_00;
  SourceLocation SVar1;
  StatementBlockSymbol *pSVar2;
  SourceLocation in_RSI;
  size_t in_RDI;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar3;
  undefined7 unaff_retaddr;
  undefined1 unaff_retaddr_00;
  StatementSyntax *in_stack_00000008;
  Scope *in_stack_00000010;
  StatementBlockSymbol *result;
  type *loc;
  type *name;
  pointer local_78;
  __extent_storage<18446744073709551615UL> local_70;
  StatementSyntax *in_stack_ffffffffffffff98;
  SourceLocation in_stack_ffffffffffffffa0;
  StatementBlockKind blockKind;
  StatementSyntax *in_stack_ffffffffffffffd8;
  Scope *in_stack_ffffffffffffffe0;
  _Optional_payload_base<slang::ast::VariableLifetime> in_stack_ffffffffffffffe8;
  
  SVar1 = parsing::Token::location((Token *)((long)in_RSI + 0x58));
  blockKind = SVar1._4_4_;
  getLabel(in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0);
  std::get<0ul,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> *)
             0x41058e);
  std::get<1ul,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_slang::SourceLocation> *)
             0x4105a0);
  std::optional<slang::ast::VariableLifetime>::optional
            ((optional<slang::ast::VariableLifetime> *)0x4105ec);
  name_00._M_str._7_1_ = unaff_retaddr_00;
  name_00._M_str._0_7_ = unaff_retaddr;
  name_00._M_len = in_RDI;
  pSVar2 = createBlock(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,name_00,in_RSI,blockKind,
                       (optional<slang::ast::VariableLifetime>)in_stack_ffffffffffffffe8);
  not_null<slang::syntax::StatementSyntax_*>::operator*
            ((not_null<slang::syntax::StatementSyntax_*> *)0x41063a);
  sVar3 = Statement::createAndAddBlockItems
                    (in_stack_00000010,in_stack_00000008,(bool)unaff_retaddr_00);
  local_78 = sVar3._M_ptr;
  (pSVar2->blocks)._M_ptr = local_78;
  local_70 = sVar3._M_extent._M_extent_value;
  (pSVar2->blocks)._M_extent._M_extent_value = local_70._M_extent_value;
  Scope::setNeedElaboration((Scope *)0x41067e);
  return pSVar2;
}

Assistant:

StatementBlockSymbol& StatementBlockSymbol::fromSyntax(const Scope& scope,
                                                       const ForeachLoopStatementSyntax& syntax) {
    auto [name, loc] = getLabel(syntax, syntax.keyword.location());
    auto result = createBlock(scope, syntax, name, loc);
    result->blocks = Statement::createAndAddBlockItems(*result, *syntax.statement,
                                                       /* labelHandled */ false);

    // This block needs elaboration to collect iteration variables.
    result->setNeedElaboration();

    return *result;
}